

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coap_test.cpp
# Opt level: O1

void __thiscall
ot::commissioner::coap::CoapTest_CoapMessageConfirmable_SeparateAck_Test::TestBody
          (CoapTest_CoapMessageConfirmable_SeparateAck_Test *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  undefined8 *puVar2;
  int iVar3;
  char *pcVar4;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar_5;
  event_base *eventBase;
  AssertionResult gtest_ar_4;
  Address localhost;
  Message request;
  MockEndpoint peer0;
  Coap coap1;
  Coap coap0;
  MockEndpoint peer1;
  AssertHelper local_820;
  undefined8 *local_818;
  undefined1 local_810 [24];
  char local_7f8 [16];
  _Alloc_hider local_7e8;
  string local_7e0;
  ErrorCode local_7bc;
  Address local_7b8;
  _Any_data local_798;
  code *local_788;
  code *pcStack_780;
  _Any_data local_778;
  code *local_768;
  code *pcStack_760;
  undefined1 local_758 [64];
  pointer local_718;
  pointer local_710;
  _Alloc_hider local_700;
  char local_6f0 [32];
  MockEndpoint local_6d0;
  Coap local_5a8;
  undefined1 local_378 [24];
  char local_360 [536];
  MockEndpoint local_148;
  
  local_7b8.mBytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_7b8.mBytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_7b8.mBytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_5a8._vptr_Coap = (_func_int **)&local_5a8.mResources;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_5a8,"127.0.0.1","");
  Address::Set((Error *)local_378,&local_7b8,(string *)&local_5a8);
  local_148.super_Endpoint._vptr_Endpoint._0_4_ = 0;
  testing::internal::CmpHelperEQ<ot::commissioner::Error,ot::commissioner::ErrorCode>
            ((internal *)&local_6d0,"localhost.Set(\"127.0.0.1\")","ErrorCode::kNone",
             (Error *)local_378,(ErrorCode *)&local_148);
  if ((char *)local_378._8_8_ != local_360) {
    operator_delete((void *)local_378._8_8_);
  }
  if ((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ot::commissioner::coap::Resource,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ot::commissioner::coap::Resource>_>_>
       *)local_5a8._vptr_Coap != &local_5a8.mResources) {
    operator_delete(local_5a8._vptr_Coap);
  }
  if ((char)local_6d0.super_Endpoint._vptr_Endpoint == '\0') {
    testing::Message::Message((Message *)local_378);
    if ((undefined8 *)
        local_6d0.super_Endpoint.mReceiver.super__Function_base._M_functor._M_unused._0_8_ ==
        (undefined8 *)0x0) {
      pcVar4 = anon_var_dwarf_434f87 + 9;
    }
    else {
      pcVar4 = *local_6d0.super_Endpoint.mReceiver.super__Function_base._M_functor._M_unused.
                _M_object;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_5a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/library/coap_test.cpp"
               ,0x1ab,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_5a8,(Message *)local_378);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_5a8);
    if ((long *)CONCAT71(local_378._1_7_,local_378[0]) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(local_378._1_7_,local_378[0]) + 8))();
    }
  }
  if ((undefined8 *)
      local_6d0.super_Endpoint.mReceiver.super__Function_base._M_functor._M_unused._0_8_ !=
      (undefined8 *)0x0) {
    if (*local_6d0.super_Endpoint.mReceiver.super__Function_base._M_functor._M_unused._M_object !=
        local_6d0.super_Endpoint.mReceiver.super__Function_base._M_functor._M_unused.
        _M_function_pointer + 0x10) {
      operator_delete(*local_6d0.super_Endpoint.mReceiver.super__Function_base._M_functor._M_unused.
                       _M_object);
    }
    operator_delete(local_6d0.super_Endpoint.mReceiver.super__Function_base._M_functor._M_unused.
                    _M_object);
  }
  local_7e8._M_p = (pointer)event_base_new();
  local_5a8._vptr_Coap = (_func_int **)0x0;
  testing::internal::CmpHelperNE<event_base*,decltype(nullptr)>
            ((internal *)local_378,"eventBase","nullptr",(event_base **)&local_7e8,
             &local_5a8._vptr_Coap);
  if (local_378[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_5a8);
    if ((char *)local_378._8_8_ == (char *)0x0) {
      pcVar4 = anon_var_dwarf_434f87 + 9;
    }
    else {
      pcVar4 = *(char **)local_378._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_6d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/library/coap_test.cpp"
               ,0x1ae,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_6d0,(Message *)&local_5a8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_6d0);
    if (local_5a8._vptr_Coap != (_func_int **)0x0) {
      (**(code **)(*local_5a8._vptr_Coap + 8))();
    }
  }
  if ((char *)local_378._8_8_ != (char *)0x0) {
    if (*(char **)local_378._8_8_ != (char *)(local_378._8_8_ + 0x10)) {
      operator_delete(*(char **)local_378._8_8_);
    }
    operator_delete((void *)local_378._8_8_);
  }
  MockEndpoint::MockEndpoint(&local_6d0,(event_base *)local_7e8._M_p,&local_7b8,0x1633);
  MockEndpoint::MockEndpoint(&local_148,(event_base *)local_7e8._M_p,&local_7b8,0x1634);
  local_6d0.mPeer = &local_148;
  local_148.mPeer = &local_6d0;
  Coap::Coap((Coap *)local_378,(event_base *)local_7e8._M_p,&local_6d0.super_Endpoint);
  Coap::Coap(&local_5a8,(event_base *)local_7e8._M_p,&local_148.super_Endpoint);
  paVar1 = &local_7e0.field_2;
  local_7e0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_7e0,"/hello","");
  local_778._8_8_ = 0;
  pcStack_760 = std::
                _Function_handler<void_(const_ot::commissioner::coap::Message_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/library/coap_test.cpp:440:5)>
                ::_M_invoke;
  local_768 = std::
              _Function_handler<void_(const_ot::commissioner::coap::Message_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/library/coap_test.cpp:440:5)>
              ::_M_manager;
  local_778._M_unused._M_object = &local_5a8;
  Resource::Resource((Resource *)local_758,&local_7e0,(RequestHandler *)&local_778);
  Coap::AddResource((Error *)local_810,&local_5a8,(Resource *)local_758);
  local_7bc = kNone;
  testing::internal::CmpHelperEQ<ot::commissioner::Error,ot::commissioner::ErrorCode>
            ((internal *)&local_820,
             "coap1.AddResource({\"/hello\", [&coap1](const Request &aRequest) { switch (0) case 0: default: if (const ::testing::AssertionResult gtest_ar_ = ::testing::AssertionResult(aRequest.IsRequest())) ; else ::testing::internal::AssertHelper(::testing::TestPartResult::kNonFatalFailure, \"/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/library/coap_test.cpp\", 442, ::testing::internal::GetBoolAssertionFailureMessage( gtest_ar_, \"aRequest.IsRequest()\", \"false\", \"true\").c_str()) = ::testing::Message(); switch (0) case 0: default: if (const ::testing::AssertionResult gtest_ar = (::testing::internal::EqHelper::Compare(\"aRequest.GetType()\", \"Type::kConfirmable\", aRequest.GetType(), Type::kConfirmable))) ; else ::testing::internal::AssertHelper(::testing::TestPartResult::kNonFatalFailure, \"/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/library/coap_test.cpp\", 443, gtest_ar.failure_message()) = ::testing::Message(); switch (0) case 0: default: if (const ::testing::AssertionResult gtest_ar = (::testing::internal::EqHelper::Compare(\"aRequest.GetCode()\", \"Code::kGet\", aRequest.GetCode(), Code::kGet))) ; else ::testing::internal::AssertHelper(::testing::TestPartResult::kNonFatalFailure, \"/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/library/coap_test.cpp\", 444, gtest_ar.failure_message()) = ::testing::Message(); ContentFormat contentFormat; switch (0) case 0: default: if (const ::testing::AssertionResult gtest_ar = (::testing::internal::EqHelper::Compare(\"aRequest.GetContentFormat(contentFormat)\", \"ErrorCode::kNone\", aRequest.GetContentFormat(contentFormat), ErrorCode::kNone))) ; else ::testing::internal::AssertHelper(::testing::TestPartResult::kNonFatalFailure, \"/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/library/coap_test.cpp\", 447, gtest_ar.failure_message()) = ::testing::Message(); switch (0) case 0: default: if (const ::testing::AssertionResult gtest_ar = (::testing::internal::EqHelper:..." /* TRUNCATED STRING LITERAL */
             ,"ErrorCode::kNone",(Error *)local_810,&local_7bc);
  if ((char *)local_810._8_8_ != local_7f8) {
    operator_delete((void *)local_810._8_8_);
  }
  if ((_Base_ptr)local_758._48_8_ != (_Base_ptr)0x0) {
    (*(code *)local_758._48_8_)(local_758 + 0x20,local_758 + 0x20,3);
  }
  if ((undefined1 *)local_758._0_8_ != local_758 + 0x10) {
    operator_delete((void *)local_758._0_8_);
  }
  if (local_768 != (code *)0x0) {
    (*local_768)(&local_778,&local_778,__destroy_functor);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_7e0._M_dataplus._M_p != paVar1) {
    operator_delete(local_7e0._M_dataplus._M_p);
  }
  if (local_820.data_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)local_758);
    if (local_818 == (undefined8 *)0x0) {
      pcVar4 = anon_var_dwarf_434f87 + 9;
    }
    else {
      pcVar4 = (char *)*local_818;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_810,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/library/coap_test.cpp"
               ,0x1cf,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_810,(Message *)local_758);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_810);
    if ((long *)local_758._0_8_ != (long *)0x0) {
      (**(code **)(*(long *)local_758._0_8_ + 8))();
    }
  }
  puVar2 = local_818;
  if (local_818 != (undefined8 *)0x0) {
    if ((undefined8 *)*local_818 != local_818 + 2) {
      operator_delete((undefined8 *)*local_818);
    }
    operator_delete(puVar2);
  }
  Message::Message((Message *)local_758,kConfirmable,kGet);
  local_7e0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_7e0,"/hello","");
  Message::SetUriPath((Error *)local_810,(Message *)local_758,&local_7e0);
  local_7bc = kNone;
  testing::internal::CmpHelperEQ<ot::commissioner::Error,ot::commissioner::ErrorCode>
            ((internal *)&local_820,"request.SetUriPath(\"/hello\")","ErrorCode::kNone",
             (Error *)local_810,&local_7bc);
  if ((char *)local_810._8_8_ != local_7f8) {
    operator_delete((void *)local_810._8_8_);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_7e0._M_dataplus._M_p != paVar1) {
    operator_delete(local_7e0._M_dataplus._M_p);
  }
  if (local_820.data_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)local_810);
    if (local_818 == (undefined8 *)0x0) {
      pcVar4 = anon_var_dwarf_434f87 + 9;
    }
    else {
      pcVar4 = (char *)*local_818;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_7e0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/library/coap_test.cpp"
               ,0x1d2,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_7e0,(Message *)local_810);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_7e0);
    if ((AssertHelperData *)local_810._0_8_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_810._0_8_ + 8))();
    }
  }
  if (local_818 != (undefined8 *)0x0) {
    if ((undefined8 *)*local_818 != local_818 + 2) {
      operator_delete((undefined8 *)*local_818);
    }
    operator_delete(local_818);
  }
  Message::SetContentFormat((Error *)local_810,(Message *)local_758,kTextPlain);
  local_820.data_._0_4_ = 0;
  testing::internal::CmpHelperEQ<ot::commissioner::Error,ot::commissioner::ErrorCode>
            ((internal *)&local_7e0,"request.SetContentFormat(ContentFormat::kTextPlain)",
             "ErrorCode::kNone",(Error *)local_810,(ErrorCode *)&local_820);
  if ((char *)local_810._8_8_ != local_7f8) {
    operator_delete((void *)local_810._8_8_);
  }
  if ((char)local_7e0._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)local_810);
    if ((undefined8 *)local_7e0._M_string_length == (undefined8 *)0x0) {
      pcVar4 = anon_var_dwarf_434f87 + 9;
    }
    else {
      pcVar4 = *(char **)local_7e0._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_820,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/library/coap_test.cpp"
               ,0x1d3,pcVar4);
    testing::internal::AssertHelper::operator=(&local_820,(Message *)local_810);
    testing::internal::AssertHelper::~AssertHelper(&local_820);
    if ((AssertHelperData *)local_810._0_8_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_810._0_8_ + 8))();
    }
  }
  if ((undefined8 *)local_7e0._M_string_length != (undefined8 *)0x0) {
    if (*(undefined8 **)local_7e0._M_string_length !=
        (undefined8 *)(local_7e0._M_string_length + 0x10)) {
      operator_delete(*(undefined8 **)local_7e0._M_string_length);
    }
    operator_delete((void *)local_7e0._M_string_length);
  }
  local_810._0_8_ = (AssertHelperData *)(local_810 + 0x10);
  std::__cxx11::string::_M_construct<char_const*>((string *)local_810,"hello, CoAP","");
  std::vector<unsigned_char,std::allocator<unsigned_char>>::
  _M_range_insert<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
            ((vector<unsigned_char,std::allocator<unsigned_char>> *)&local_718,local_710,
             local_810._0_8_,(char *)(local_810._8_8_ + local_810._0_8_));
  if ((AssertHelperData *)local_810._0_8_ != (AssertHelperData *)(local_810 + 0x10)) {
    operator_delete((void *)local_810._0_8_);
  }
  local_798._8_8_ = 0;
  pcStack_780 = std::
                _Function_handler<void_(const_ot::commissioner::coap::Message_*,_ot::commissioner::Error),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/library/coap_test.cpp:470:32)>
                ::_M_invoke;
  local_788 = std::
              _Function_handler<void_(const_ot::commissioner::coap::Message_*,_ot::commissioner::Error),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/library/coap_test.cpp:470:32)>
              ::_M_manager;
  local_798._M_unused._M_object = &local_7e8;
  Coap::SendRequest((Coap *)local_378,(Request *)local_758,(ResponseHandler *)&local_798);
  if (local_788 != (code *)0x0) {
    (*local_788)(&local_798,&local_798,__destroy_functor);
  }
  iVar3 = event_base_loop((event_base *)local_7e8._M_p,4);
  local_7e0._M_dataplus._M_p._0_4_ = iVar3;
  local_820.data_._0_4_ = 0;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)local_810,"event_base_loop(eventBase, 0x04)","0",(int *)&local_7e0,
             (int *)&local_820);
  if (local_810[0] == (string)0x0) {
    testing::Message::Message((Message *)&local_7e0);
    if ((char *)local_810._8_8_ == (char *)0x0) {
      pcVar4 = anon_var_dwarf_434f87 + 9;
    }
    else {
      pcVar4 = *(char **)local_810._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_820,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/library/coap_test.cpp"
               ,0x1e4,pcVar4);
    testing::internal::AssertHelper::operator=(&local_820,(Message *)&local_7e0);
    testing::internal::AssertHelper::~AssertHelper(&local_820);
    if ((long *)local_7e0._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_7e0._M_dataplus._M_p + 8))();
    }
  }
  if ((char *)local_810._8_8_ != (char *)0x0) {
    if (*(char **)local_810._8_8_ != (char *)(local_810._8_8_ + 0x10)) {
      operator_delete(*(char **)local_810._8_8_);
    }
    operator_delete((void *)local_810._8_8_);
  }
  event_base_free((event_base *)local_7e8._M_p);
  if (local_700._M_p != local_6f0) {
    operator_delete(local_700._M_p);
  }
  if (local_718 != (pointer)0x0) {
    operator_delete(local_718);
  }
  std::
  _Rb_tree<ot::commissioner::coap::OptionType,_std::pair<const_ot::commissioner::coap::OptionType,_ot::commissioner::coap::OptionValue>,_std::_Select1st<std::pair<const_ot::commissioner::coap::OptionType,_ot::commissioner::coap::OptionValue>_>,_std::less<ot::commissioner::coap::OptionType>,_std::allocator<std::pair<const_ot::commissioner::coap::OptionType,_ot::commissioner::coap::OptionValue>_>_>
  ::~_Rb_tree((_Rb_tree<ot::commissioner::coap::OptionType,_std::pair<const_ot::commissioner::coap::OptionType,_ot::commissioner::coap::OptionValue>,_std::_Select1st<std::pair<const_ot::commissioner::coap::OptionType,_ot::commissioner::coap::OptionValue>_>,_std::less<ot::commissioner::coap::OptionType>,_std::allocator<std::pair<const_ot::commissioner::coap::OptionType,_ot::commissioner::coap::OptionValue>_>_>
               *)(local_758 + 0x10));
  Coap::~Coap(&local_5a8);
  Coap::~Coap((Coap *)local_378);
  MockEndpoint::~MockEndpoint(&local_148);
  MockEndpoint::~MockEndpoint(&local_6d0);
  if (local_7b8.mBytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_7b8.mBytes.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

TEST(CoapTest, CoapMessageHeader_ValidVersion)
{
    ByteArray buffer{0x40, 0x00, 0x00, 0x00};
    Error     error;
    auto      message = Message::Deserialize(error, buffer);

    EXPECT_NE(message, nullptr);
    EXPECT_EQ(error, ErrorCode::kNone);

    EXPECT_EQ(message->GetVersion(), kVersion1);
    EXPECT_EQ(message->GetType(), Type::kConfirmable);
    EXPECT_EQ(message->GetToken().size(), 0);
    EXPECT_EQ(message->GetCode(), utils::from_underlying<Code>(0));
    EXPECT_EQ(message->GetMessageId(), 0);
}